

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void read_bytes<int,short>
               (void *ptr,size_t n_els,FILE **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian)

{
  FILE *__stream;
  int iVar1;
  size_t sVar2;
  pointer __ptr;
  
  if (n_els == 0) {
    return;
  }
  iVar1 = feof((FILE *)*in);
  if (iVar1 == 0) {
    __ptr = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start;
    if ((ulong)((long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)__ptr) < n_els * 2) {
      std::vector<char,_std::allocator<char>_>::resize(buffer,n_els * 4);
      __ptr = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    }
    sVar2 = fread(__ptr,2,n_els,(FILE *)*in);
    __stream = (FILE *)*in;
    if (sVar2 == n_els) {
      iVar1 = ferror(__stream);
      if (iVar1 == 0) {
        if (diff_endian) {
          swap_endianness<short>
                    ((short *)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                              super__Vector_impl_data._M_start,n_els);
        }
        convert_dtype<int,short>(ptr,buffer,n_els);
        return;
      }
    }
    throw_ferror((FILE *)__stream);
  }
  throw_feoferr();
}

Assistant:

void read_bytes(void *ptr, const size_t n_els, FILE *&in, std::vector<char> &buffer, const bool diff_endian)
{
    if (std::is_same<dtype, saved_type>::value)
    {
        read_bytes<dtype>(ptr, n_els, in);
        if (unlikely(diff_endian)) swap_endianness((dtype*)ptr, n_els);
        return;
    }
    if (n_els == 0) return;
    if (unlikely(feof(in))) throw_feoferr();
    if (unlikely(buffer.size() < n_els * sizeof(saved_type)))
        buffer.resize((size_t)2 * n_els * sizeof(saved_type));
    size_t n_read = fread(buffer.data(), sizeof(saved_type), n_els, in);
    if (unlikely(n_read != n_els || ferror(in))) throw_ferror(in);

    if (unlikely(diff_endian)) swap_endianness((saved_type*)buffer.data(), n_els);
    convert_dtype<dtype, saved_type>(ptr, buffer, n_els);
}